

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  char16_t cVar1;
  long lVar2;
  QChar *pQVar3;
  QChar *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  char16_t local_48 [20];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (p->a).a.m_size;
  QAbstractConcatenable::appendLatin1To((p->a).a,*out);
  pQVar4 = *out;
  *out = pQVar4 + lVar2;
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  lVar5 = 0;
  pQVar4 = pQVar4 + lVar2 + 1;
  do {
    pQVar3 = pQVar4;
    cVar1 = local_48[*(byte *)((long)&(p->a).b.val + lVar5) & 0xf];
    *out = pQVar3;
    pQVar3[-1].ucs = cVar1;
    cVar1 = local_48[*(byte *)((long)&(p->a).b.val + lVar5) >> 4];
    *out = pQVar3 + 1;
    pQVar3->ucs = cVar1;
    lVar5 = lVar5 + 1;
    pQVar4 = pQVar3 + 2;
  } while ((int)lVar5 != 8);
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  cVar1 = local_48[(p->b).val & 0xf];
  *out = pQVar4;
  pQVar3[1].ucs = cVar1;
  cVar1 = local_48[(p->b).val >> 4];
  *out = pQVar3 + 3;
  pQVar4->ucs = cVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }